

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int __thiscall zmq::detail::socket_base::get<69,int,true>(socket_base *this)

{
  size_t local_28;
  size_t size;
  socket_base *psStack_18;
  int val;
  socket_base *this_local;
  
  local_28 = 4;
  psStack_18 = this;
  get_option(this,0x45,(void *)((long)&size + 4),&local_28);
  if (local_28 == 4) {
    return size._4_4_;
  }
  __assert_fail("size == sizeof val",
                "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",0x72c,
                "T zmq::detail::socket_base::get(sockopt::integral_option<Opt, T, BoolUnit>) const [Opt = 69, T = int, BoolUnit = true]"
               );
}

Assistant:

ZMQ_NODISCARD T get(sockopt::integral_option<Opt, T, BoolUnit>) const
    {
        static_assert(std::is_scalar<T>::value, "T must be scalar");
        T val;
        size_t size = sizeof val;
        get_option(Opt, &val, &size);
        assert(size == sizeof val);
        return val;
    }